

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

from_chars_result __thiscall
semver::detail::lexer::scan_tokens(lexer *this,token_stream *token_stream)

{
  token_stream *this_00;
  bool bVar1;
  const_pointer pvVar2;
  size_type sVar3;
  from_chars_result fVar4;
  token local_48;
  lexer *local_38;
  errc local_30;
  token_stream *local_28;
  token_stream *token_stream_local;
  lexer *this_local;
  from_chars_result result;
  
  local_28 = token_stream;
  token_stream_local = (token_stream *)this;
  this_local = (lexer *)std::basic_string_view<char,_std::char_traits<char>_>::data(&this->text_);
  result.super_from_chars_result.ptr._0_4_ = 0;
  do {
    bVar1 = is_eol(this);
    this_00 = local_28;
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_48.type = eol;
      memset(&local_48.value,0,2);
      std::variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>::variant
                (&local_48.value);
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&this->text_);
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->text_);
      local_48.lexeme = pvVar2 + sVar3;
      detail::token_stream::push(this_00,&local_48);
      break;
    }
    fVar4 = scan_token(this,local_28);
    local_38 = (lexer *)fVar4.super_from_chars_result.ptr;
    local_30 = fVar4.super_from_chars_result.ec;
    this_local = local_38;
    result.super_from_chars_result.ptr._0_4_ = local_30;
    bVar1 = from_chars_result::operator_cast_to_bool((from_chars_result *)&this_local);
  } while (bVar1);
  fVar4.super_from_chars_result.ec = (errc)result.super_from_chars_result.ptr;
  fVar4.super_from_chars_result.ptr = (char *)this_local;
  fVar4.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar4.super_from_chars_result;
}

Assistant:

scan_tokens(token_stream& token_stream) noexcept {
    from_chars_result result{ text_.data(), std::errc{} };

    while (!is_eol()) {
      result = scan_token(token_stream);
      if (!result) {
        return result;
      }
    }

    token_stream.push({ token_type::eol, {}, text_.data() + text_.size() });

    return result;
  }